

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int out_is_hidden(void)

{
  if (outflag == '\0') {
    if ((dbghid != 0) && ((hidout & 1) == 0)) {
      trchid();
    }
    hidout = 1;
    if (dbghid == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int out_is_hidden()
{
    /* check the output flag */
    if (!outflag)
    {
        /* trace the hidden output if desired */
        if (dbghid && !hidout)
            trchid();

        /* note the hidden output */
        hidout = 1;

        /* 
         *   unless we're showing hidden text in the debugger, we're
         *   suppressing output, so return true 
         */
        if (!dbghid)
            return TRUE;
    }

    /* we're not suppressing output */
    return FALSE;
}